

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

char * NULLCString::strcpy(char *__dest,char *__src)

{
  char *pcVar1;
  int in_ECX;
  long in_RDX;
  
  if (__dest == (char *)0x0) {
    pcVar1 = "destination string is null";
  }
  else if (in_RDX == 0) {
    pcVar1 = "source string is null";
  }
  else {
    if (in_ECX != 0) {
      pcVar1 = (char *)0x0;
      do {
        if ((int)__src == (int)pcVar1) {
          pcVar1 = "buffer overflow";
          goto LAB_0012981b;
        }
        if (pcVar1[in_RDX] == '\0') {
          __dest[(long)pcVar1] = '\0';
          return pcVar1;
        }
        __dest[(long)pcVar1] = pcVar1[in_RDX];
        pcVar1 = pcVar1 + 1;
      } while (in_ECX != (int)pcVar1);
    }
    pcVar1 = "string is not null-terminated";
  }
LAB_0012981b:
  nullcThrowError(pcVar1);
  return (char *)0xffffffff;
}

Assistant:

int strcpy(NULLCArray dst, NULLCArray src)
	{
		if(!dst.ptr)
		{
			nullcThrowError("destination string is null");
			return -1;
		}

		if(!src.ptr)
		{
			nullcThrowError("source string is null");
			return -1;
		}

		for(unsigned i = 0; i < src.len; i++)
		{
			if(i >= dst.len)
			{
				nullcThrowError("buffer overflow");
				return -1;
			}

			if(!src.ptr[i])
			{
				dst.ptr[i] = 0;

				return i;
			}
			else
			{
				dst.ptr[i] = src.ptr[i];
			}
		}

		nullcThrowError("string is not null-terminated");
		return -1;
	}